

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

FlagBase * __thiscall args::HelpFlag::Match(HelpFlag *this,char arg)

{
  FlagBase *pFVar1;
  Help *this_00;
  string local_38;
  
  pFVar1 = FlagBase::Match((FlagBase *)this,arg);
  if (pFVar1 == (FlagBase *)0x0) {
    return (FlagBase *)0x0;
  }
  this_00 = (Help *)__cxa_allocate_exception(0x10);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_38,'\x01');
  Help::Help(this_00,&local_38);
  __cxa_throw(this_00,&Help::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual FlagBase *Match(const char arg) override
            {
                if (FlagBase::Match(arg))
                {
#ifdef ARGS_NOEXCEPT
                    error = Error::Help;
                    return this;
#else
                    throw Help(std::string(1, arg));
#endif
                }
                return nullptr;
            }